

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

int P_PushDown(AActor *thing,FChangePosition *cpos)

{
  AActor *this;
  uint uVar1;
  int iVar2;
  AActor **ppAVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double oldz;
  TFlags<ActorFlag3,_unsigned_int> local_40;
  TFlags<ActorFlag2,_unsigned_int> local_3c;
  AActor *local_38;
  AActor *intersect;
  uint local_28;
  int mymass;
  uint lastintersect;
  uint firstintersect;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  _lastintersect = cpos;
  cpos_local = (FChangePosition *)thing;
  mymass = TArray<AActor_*,_AActor_*>::Size(&intersectors);
  intersect._4_4_ = *(int *)&cpos_local[0x2a].moveamt;
  dVar5 = AActor::Z((AActor *)cpos_local);
  if (cpos_local[0xd].moveamt < dVar5) {
    P_FindBelowIntersectors((AActor *)cpos_local);
    local_28 = TArray<AActor_*,_AActor_*>::Size(&intersectors);
    for (; (uint)mymass < local_28; mymass = mymass + 1) {
      ppAVar3 = TArray<AActor_*,_AActor_*>::operator[](&intersectors,(ulong)(uint)mymass);
      local_38 = *ppAVar3;
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_3c,(int)local_38 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
      bVar4 = true;
      if (uVar1 != 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_40,
                   (int)local_38 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG)
                  );
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
        if ((uVar1 != 0) || (bVar4 = true, local_38->Mass <= intersect._4_4_)) {
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    ((TFlags<ActorFlag4,_unsigned_int> *)((long)&oldz + 4),
                     (int)local_38 +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&oldz + 4));
          bVar4 = uVar1 != 0;
        }
      }
      if (bVar4) {
        return 2;
      }
      dVar5 = AActor::Z(local_38);
      P_AdjustFloorCeil(local_38,_lastintersect);
      dVar6 = AActor::Z((AActor *)cpos_local);
      this = local_38;
      if (dVar6 - local_38->Height < dVar5) {
        dVar6 = AActor::Z((AActor *)cpos_local);
        AActor::SetZ(this,dVar6 - local_38->Height,true);
        iVar2 = P_PushDown(local_38,_lastintersect);
        if (iVar2 != 0) {
          P_DoCrunch(local_38,_lastintersect);
          AActor::SetZ(local_38,dVar5,true);
          return 2;
        }
        AActor::UpdateRenderSectorList(local_38);
      }
    }
    AActor::CheckPortalTransition((AActor *)cpos_local,true);
    thing_local._4_4_ = 0;
  }
  else {
    thing_local._4_4_ = 1;
  }
  return thing_local._4_4_;
}

Assistant:

int P_PushDown(AActor *thing, FChangePosition *cpos)
{
	unsigned int firstintersect = intersectors.Size();
	unsigned int lastintersect;
	int mymass = thing->Mass;

	if (thing->Z() <= thing->floorz)
	{
		return 1;
	}
	P_FindBelowIntersectors(thing);
	lastintersect = intersectors.Size();
	for (; firstintersect < lastintersect; firstintersect++)
	{
		AActor *intersect = intersectors[firstintersect];
		if (!(intersect->flags2 & MF2_PASSMOBJ) ||
			(!(intersect->flags3 & MF3_ISMONSTER) && intersect->Mass > mymass) ||
			(intersect->flags4 & MF4_ACTLIKEBRIDGE)
			)
		{
			// Can't push bridges or things more massive than ourself
			return 2;
		}
		double oldz = intersect->Z();
		P_AdjustFloorCeil(intersect, cpos);
		if (oldz > thing->Z() - intersect->Height)
		{ // Only push things down, not up.
			intersect->SetZ(thing->Z() - intersect->Height);
			if (P_PushDown(intersect, cpos))
			{ // Move blocked
				P_DoCrunch(intersect, cpos);
				intersect->SetZ(oldz);
				return 2;
			}
			intersect->UpdateRenderSectorList();
		}
	}
	thing->CheckPortalTransition(true);
	return 0;
}